

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_pic.cpp
# Opt level: O3

void __thiscall
QPicturePaintEngine::drawPixmap(QPicturePaintEngine *this,QRectF *r,QPixmap *pm,QRectF *sr)

{
  int *piVar1;
  QPaintEnginePrivate *pQVar2;
  QPaintEnginePrivate *pQVar3;
  long lVar4;
  qsizetype i;
  int pos;
  QDataStream *pQVar5;
  
  pQVar3 = (this->super_QPaintEngine).d_ptr.d;
  piVar1 = (int *)(*(long *)&pQVar3[1].systemRect + 0x18);
  *piVar1 = *piVar1 + 1;
  pQVar2 = pQVar3 + 1;
  QDataStream::operator<<((QDataStream *)pQVar2,0x11);
  QDataStream::operator<<((QDataStream *)pQVar2,0);
  pos = QBuffer::pos();
  lVar4 = *(long *)&pQVar3[1].systemRect;
  if (*(char *)(lVar4 + 0x50) == '\x01') {
    i = *(qsizetype *)(lVar4 + 0x80);
    QtPrivate::QMovableArrayOps<QPixmap>::emplace<QPixmap_const&>
              ((QMovableArrayOps<QPixmap> *)(lVar4 + 0x70),i,pm);
    QList<QPixmap>::end((QList<QPixmap> *)(lVar4 + 0x70));
    pQVar5 = (QDataStream *)::operator<<((QDataStream *)pQVar2,r);
    pQVar5 = (QDataStream *)QDataStream::operator<<(pQVar5,(int)i);
  }
  else {
    pQVar5 = (QDataStream *)::operator<<((QDataStream *)pQVar2,r);
    pQVar5 = ::operator<<(pQVar5,pm);
  }
  ::operator<<(pQVar5,sr);
  writeCmdLength(this,pos,r,false);
  return;
}

Assistant:

void QPicturePaintEngine::drawPixmap(const QRectF &r, const QPixmap &pm, const QRectF &sr)
{
    Q_D(QPicturePaintEngine);
#ifdef QT_PICTURE_DEBUG
    qDebug() << " -> drawPixmap():" << r;
#endif
    int pos;
    SERIALIZE_CMD(QPicturePrivate::PdcDrawPixmap);

    if (d->pic_d->in_memory_only) {
        int index = d->pic_d->pixmap_list.size();
        d->pic_d->pixmap_list.append(pm);
        d->s << r << index << sr;
    } else {
        d->s << r << pm << sr;
    }
    writeCmdLength(pos, r, false);
}